

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void kratos::change_property_into_stmt(Generator *top)

{
  undefined1 local_58 [8];
  GeneratorPropertyVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  GeneratorPropertyVisitor::GeneratorPropertyVisitor((GeneratorPropertyVisitor *)local_58);
  IRVisitor::visit_generator_root_p
            ((IRVisitor *)local_58,
             (Generator *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  GeneratorPropertyVisitor::~GeneratorPropertyVisitor((GeneratorPropertyVisitor *)local_58);
  return;
}

Assistant:

void change_property_into_stmt(Generator* top) {
    GeneratorPropertyVisitor visitor;
    visitor.visit_generator_root_p(top);
}